

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

Token * Assimp::FBX::GetRequiredToken(Element *el,uint index)

{
  pointer ppTVar1;
  string local_1b0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  
  ppTVar1 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(el->tokens).
                    super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
    return ppTVar1[index];
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[24]>(&local_190,(char (*) [24])"missing token at index ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::__cxx11::stringbuf::str();
  anon_unknown.dwarf_227350::ParseError(&local_1b0,el);
}

Assistant:

const Token& GetRequiredToken(const Element& el, unsigned int index)
{
    const TokenList& t = el.Tokens();
    if(index >= t.size()) {
        ParseError(Formatter::format( "missing token at index " ) << index,&el);
    }

    return *t[index];
}